

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O1

void dummy_Op_NegateInPlace(void)

{
  return;
}

Assistant:

Var JavascriptMath::Not_Full(Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Not_Full);
#if _M_IX86
            AssertMsg(!TaggedInt::Is(aRight), "Should be detected");
#endif
            if (JavascriptOperators::GetTypeId(aRight) == TypeIds_BigInt)
            {
                return JavascriptBigInt::Not(aRight);
            }

            int nValue = JavascriptConversion::ToInt32(aRight, scriptContext);
            return JavascriptNumber::ToVar(~nValue, scriptContext);
            JIT_HELPER_END(Op_Not_Full);
        }